

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::
argument_loader<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>const&,Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>const&,Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>const&,Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>const&>
::load_impl_sequence<0ul,1ul,2ul,3ul>
          (argument_loader<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>const&,Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>const&,Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>const&,Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>const&>
           *this,long call)

{
  bool bVar1;
  
  bVar1 = type_caster<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_void>
          ::load((type_caster<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_void>
                  *)(this + 0x48),(PyObject *)**(undefined8 **)(call + 8),
                 (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  if (bVar1) {
    bVar1 = type_caster<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_void>
            ::load((type_caster<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_void>
                    *)(this + 0x30),*(PyObject **)(*(long *)(call + 8) + 8),
                   SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
    if (bVar1) {
      bVar1 = type_caster<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_void>
              ::load((type_caster<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_void>
                      *)(this + 0x18),*(PyObject **)(*(long *)(call + 8) + 0x10),
                     SUB41((**(uint **)(call + 0x20) & 4) >> 2,0));
      if (bVar1) {
        bVar1 = type_caster<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_void>
                ::load((type_caster<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_void>
                        *)this,*(PyObject **)(*(long *)(call + 8) + 0x18),
                       SUB41((**(uint **)(call + 0x20) & 8) >> 3,0));
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }